

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O2

void Js::HandleHelperOrLibraryMethodWrapperException<false>
               (ScriptContext *scriptContext,JavascriptExceptionObject *exceptionObject)

{
  ProbeContainer *this;
  code *pcVar1;
  int iVar2;
  bool bVar3;
  undefined4 *puVar4;
  JavascriptExceptionObject *pJVar5;
  DebugContext *pDVar6;
  DebuggingFlags *this_00;
  FunctionBody *pFVar7;
  undefined1 local_48 [8];
  ByteCodeReader reader;
  int nextStatementOffset;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0xd3,"(scriptContext)","scriptContext");
    if (!bVar3) goto LAB_007e5923;
    *puVar4 = 0;
  }
  if (exceptionObject == (JavascriptExceptionObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0xd4,"(exceptionObject)","exceptionObject");
    if (!bVar3) goto LAB_007e5923;
    *puVar4 = 0;
  }
  if ((((exceptionObject->field_0x14 & 4) != 0) &&
      (pJVar5 = ThreadContext::GetPendingOOMErrorObject(scriptContext->threadContext),
      pJVar5 != exceptionObject)) &&
     (pJVar5 = ThreadContext::GetPendingSOErrorObject(scriptContext->threadContext),
     pJVar5 != exceptionObject)) {
    if ((exceptionObject->field_0x14 & 4) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                  ,0xf0,"(exceptionObject->IsDebuggerSkip())",
                                  "exceptionObject->IsDebuggerSkip()");
      if (!bVar3) {
LAB_007e5923:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    iVar2 = exceptionObject->byteCodeOffsetAfterDebuggerSkip;
    if (exceptionObject->byteCodeOffsetAfterDebuggerSkip == -1) {
      pFVar7 = JavascriptExceptionObject::GetFunctionBody(exceptionObject);
      ByteCodeReader::Create
                ((ByteCodeReader *)local_48,pFVar7,
                 (exceptionObject->exceptionContext).m_throwingFunctionByteCodeOffset);
      pDVar6 = ScriptContext::GetDebugContext(scriptContext);
      this = pDVar6->diagProbesContainer;
      pFVar7 = JavascriptExceptionObject::GetFunctionBody(exceptionObject);
      bVar3 = ProbeContainer::GetNextUserStatementOffsetForAdvance
                        (this,pFVar7,(ByteCodeReader *)local_48,
                         (exceptionObject->exceptionContext).m_throwingFunctionByteCodeOffset,
                         (int *)((long)&reader.m_endLocation + 4));
      iVar2 = reader.m_endLocation._4_4_;
      if (!bVar3) goto LAB_007e5918;
    }
    reader.m_endLocation._4_4_ = iVar2;
    this_00 = DebugManager::GetDebuggingFlags(scriptContext->threadContext->debugManager);
    iVar2 = reader.m_endLocation._4_4_;
    pFVar7 = JavascriptExceptionObject::GetFunctionBody(exceptionObject);
    DebuggingFlags::SetByteCodeOffsetAndFuncAfterIgnoreException
              (this_00,iVar2,
               (pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.m_functionNumber);
    return;
  }
LAB_007e5918:
  JavascriptExceptionOperators::DoThrowCheckClone(exceptionObject,scriptContext);
}

Assistant:

void HandleHelperOrLibraryMethodWrapperException(ScriptContext * scriptContext, JavascriptExceptionObject * exceptionObject)
    {
        Assert(scriptContext);
        Assert(exceptionObject);

        // Note: there also could be plain OutOfMemoryException and StackOverflowException, no special handling for these.
        if (!exceptionObject->IsDebuggerSkip() ||
            exceptionObject == scriptContext->GetThreadContext()->GetPendingOOMErrorObject() ||
            exceptionObject == scriptContext->GetThreadContext()->GetPendingSOErrorObject())
        {
            JavascriptExceptionOperators::DoThrowCheckClone(exceptionObject, scriptContext);
        }

        if (doCheckParentInterpreterFrame)
        {
            // Note: JavascriptStackWalker is slow, but this is not hot path at all.
            // Note: we treat internal script code (such as Intl) as library code, thus
            //       ignore isLibraryCode=true callers.
            bool isTopUserFrameNative;
            bool isTopUserFrameJavaScript = Js::JavascriptStackWalker::TryIsTopJavaScriptFrameNative(
                scriptContext, &isTopUserFrameNative, /* ignoreLibraryCode = */ true);
            AssertMsg(isTopUserFrameJavaScript, "How could we get non-javascript frame on exception?");

            if (isTopUserFrameJavaScript && !isTopUserFrameNative)
            {
                // If parent frame is interpreter frame, it already has try-catch around all calls,
                // so that we don't need any special handling here.
                JavascriptExceptionOperators::DoThrowCheckClone(exceptionObject, scriptContext);
            }
        }

        Assert(exceptionObject->IsDebuggerSkip());
        int nextStatementOffset;
        int offsetFromDebugger = exceptionObject->GetByteCodeOffsetAfterDebuggerSkip();
        if (offsetFromDebugger != DebuggingFlags::InvalidByteCodeOffset)
        {
            // The offset is already set for us by debugger (such as by set next statement).
            nextStatementOffset = offsetFromDebugger;
        }
        else
        {
            ByteCodeReader reader;
            reader.Create(exceptionObject->GetFunctionBody(), exceptionObject->GetByteCodeOffset());
            // Determine offset for next statement here.
            if (!scriptContext->GetDebugContext()->GetProbeContainer()->GetNextUserStatementOffsetForAdvance(
                exceptionObject->GetFunctionBody(), &reader, exceptionObject->GetByteCodeOffset(), &nextStatementOffset))
            {
                // Can't advance.
                JavascriptExceptionOperators::DoThrowCheckClone(exceptionObject, scriptContext);
            }
        }

        // Continue after exception.
        // Note: for this scenario InterpreterStackFrame::DebugProcess resets its state,
        // looks like we don't need to that because we start with brand new interpreter frame.

        // Indicate to bailout check that we should bail out for/into debugger and set the byte code offset to one of next statement.
        scriptContext->GetThreadContext()->GetDebugManager()->GetDebuggingFlags()->SetByteCodeOffsetAndFuncAfterIgnoreException(
            nextStatementOffset, exceptionObject->GetFunctionBody()->GetFunctionNumber());
    }